

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void decode_tile_sb_row(AV1Decoder *pbi,ThreadData *td,TileInfo *tile_info,int mi_row)

{
  int num_planes_00;
  int iVar1;
  int iVar2;
  int mi_col_00;
  int in_ECX;
  TileInfo *in_RDX;
  DecoderCodingBlock *in_RSI;
  AV1Decoder *in_RDI;
  int mi_col;
  int row_mt_exit;
  int sb_col_in_tile;
  int sb_row_in_tile;
  int sb_cols_in_tile;
  TileDataDec *tile_data;
  int num_planes;
  AV1_COMMON *cm;
  ThreadData *in_stack_00000058;
  AV1Decoder *in_stack_00000060;
  int in_stack_00000070;
  int c;
  int r;
  
  num_planes_00 = av1_num_planes(&in_RDI->common);
  iVar1 = av1_get_sb_cols_in_tile(&in_RDI->common,in_RDX);
  iVar2 = in_ECX - in_RDX->mi_row_start >>
          ((byte)((in_RDI->common).seq_params)->mib_size_log2 & 0x1f);
  r = 0;
  c = 0;
  for (mi_col_00 = in_RDX->mi_col_start; mi_col_00 < in_RDX->mi_col_end;
      mi_col_00 = ((in_RDI->common).seq_params)->mib_size + mi_col_00) {
    set_cb_buffer(in_RDI,in_RSI,in_RDI->cb_buffer_base,num_planes_00,in_ECX,mi_col_00);
    sync_read((AV1DecRowMTSync *)CONCAT44(iVar1,iVar2),r,c);
    pthread_mutex_lock((pthread_mutex_t *)in_RDI->row_mt_mutex_);
    c = (in_RDI->frame_row_mt_info).row_mt_exit;
    pthread_mutex_unlock((pthread_mutex_t *)in_RDI->row_mt_mutex_);
    if (c == 0) {
      decode_partition(in_stack_00000060,in_stack_00000058,pbi._4_4_,(int)pbi,(aom_reader *)td,
                       tile_info._7_1_,in_stack_00000070);
    }
    sync_write((AV1DecRowMTSync *)CONCAT44(iVar1,iVar2),r,c,mi_col_00);
    r = r + 1;
  }
  return;
}

Assistant:

static inline void decode_tile_sb_row(AV1Decoder *pbi, ThreadData *const td,
                                      const TileInfo *tile_info,
                                      const int mi_row) {
  AV1_COMMON *const cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);
  TileDataDec *const tile_data = pbi->tile_data +
                                 tile_info->tile_row * cm->tiles.cols +
                                 tile_info->tile_col;
  const int sb_cols_in_tile = av1_get_sb_cols_in_tile(cm, tile_info);
  const int sb_row_in_tile =
      (mi_row - tile_info->mi_row_start) >> cm->seq_params->mib_size_log2;
  int sb_col_in_tile = 0;
  int row_mt_exit = 0;

  for (int mi_col = tile_info->mi_col_start; mi_col < tile_info->mi_col_end;
       mi_col += cm->seq_params->mib_size, sb_col_in_tile++) {
    set_cb_buffer(pbi, &td->dcb, pbi->cb_buffer_base, num_planes, mi_row,
                  mi_col);

    sync_read(&tile_data->dec_row_mt_sync, sb_row_in_tile, sb_col_in_tile);

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
    row_mt_exit = pbi->frame_row_mt_info.row_mt_exit;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif

    if (!row_mt_exit) {
      // Decoding of the super-block
      decode_partition(pbi, td, mi_row, mi_col, td->bit_reader,
                       cm->seq_params->sb_size, 0x2);
    }

    sync_write(&tile_data->dec_row_mt_sync, sb_row_in_tile, sb_col_in_tile,
               sb_cols_in_tile);
  }
}